

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O1

bool FIX::TimeRange::isInSameRange(DateTime *start,DateTime *end,DateTime *time1,DateTime *time2)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  
  bVar4 = isInRange(start,end,time1);
  if ((bVar4) && (bVar4 = isInRange(start,end,time2), bVar4)) {
    iVar8 = time1->m_date;
    iVar1 = time2->m_date;
    bVar10 = iVar8 == iVar1;
    lVar5 = time1->m_time;
    lVar2 = time2->m_time;
    bVar4 = true;
    if (!bVar10 || lVar5 != lVar2) {
      iVar7 = start->m_date;
      iVar9 = end->m_date;
      bVar4 = bVar10;
      if ((iVar9 <= iVar7) && ((iVar9 < iVar7 || (end->m_time <= start->m_time)))) {
        lVar6 = start->m_time;
        if (iVar7 - iVar9 != 0 || lVar6 != end->m_time) {
          auVar3 = SEXT816(end->m_time) * SEXT816(0x112e0be826d694b3);
          iVar9 = ((int)(SUB168(SEXT816(lVar6) * SEXT816(-0x112e0be826d694b3),8) >> 0x1a) -
                  (SUB164(SEXT816(lVar6) * SEXT816(-0x112e0be826d694b3),0xc) >> 0x1f)) +
                  (iVar7 - iVar9) * -0x15180 +
                  ((int)(auVar3._8_8_ >> 0x1a) - (auVar3._12_4_ >> 0x1f)) + 0x15180;
          if ((iVar8 < iVar1) || (lVar5 < lVar2 && (iVar8 - iVar1 == 0 || iVar8 < iVar1))) {
            iVar8 = ((int)(SUB168(SEXT816(lVar5) * SEXT816(-0x112e0be826d694b3),8) >> 0x1a) -
                    (SUB164(SEXT816(lVar5) * SEXT816(-0x112e0be826d694b3),0xc) >> 0x1f)) +
                    ((int)(SUB168(SEXT816(lVar2) * SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
                    (SUB164(SEXT816(lVar2) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f)) +
                    (iVar1 - iVar8) * 0x15180;
            bVar11 = SBORROW4(iVar9,iVar8);
            bVar10 = iVar9 - iVar8 < 0;
            bVar4 = iVar9 == iVar8;
          }
          else {
            iVar7 = ((int)(SUB168(SEXT816(lVar6) * SEXT816(-0x112e0be826d694b3),8) >> 0x1a) -
                    (SUB164(SEXT816(lVar6) * SEXT816(-0x112e0be826d694b3),0xc) >> 0x1f)) +
                    (int)(time2->m_time / 1000000000) + iVar7 * -0x15180;
            lVar6 = (long)iVar7 + 0x15180;
            if (-1 < iVar7) {
              lVar6 = (long)iVar7;
            }
            lVar5 = (long)(((int)(SUB168(SEXT816(lVar2) * SEXT816(-0x112e0be826d694b3),8) >> 0x1a) -
                           (SUB164(SEXT816(lVar2) * SEXT816(-0x112e0be826d694b3),0xc) >> 0x1f)) +
                           ((int)(SUB168(SEXT816(lVar5) * SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
                           (SUB164(SEXT816(lVar5) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f)) +
                          (iVar8 - iVar1) * 0x15180);
            lVar6 = iVar9 - lVar6;
            bVar11 = SBORROW8(lVar6,lVar5);
            bVar10 = lVar6 - lVar5 < 0;
            bVar4 = lVar6 == lVar5;
          }
          bVar4 = !bVar4 && bVar11 == bVar10;
        }
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool TimeRange::isInSameRange(
    const DateTime &start,
    const DateTime &end,
    const DateTime &time1,
    const DateTime &time2) {
  if (!isInRange(start, end, time1)) {
    return false;
  }
  if (!isInRange(start, end, time2)) {
    return false;
  }

  if (time1 == time2) {
    return true;
  }

  if (start < end || start == end) {
    UtcDate time1Date(time1);
    UtcDate time2Date(time2);

    return time1Date == time2Date;
  } else {
    int sessionLength = DateTime::SECONDS_PER_DAY - (start - end);

    if (time1 > time2) {
      UtcTimeOnly time2TimeOnly = UtcTimeOnly(time2);

      long delta = time2TimeOnly - start;
      if (delta < 0) {
        delta = DateTime::SECONDS_PER_DAY - labs(delta);
      }

      return (time1 - time2) < (sessionLength - delta);
    } else {
      return (time2 - time1) < sessionLength;
    }
  }
}